

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

void mriStepInnerStepper_PrintMem(MRIStepInnerStepper stepper,FILE *outfile)

{
  if (stepper != (MRIStepInnerStepper)0x0) {
    fwrite("MRIStepInnerStepper Mem:\n",0x19,1,(FILE *)outfile);
    fprintf((FILE *)outfile,"MRIStepInnerStepper: inner_nforcing = %i\n",
            (ulong)(uint)stepper->nforcing);
    return;
  }
  return;
}

Assistant:

void mriStepInnerStepper_PrintMem(MRIStepInnerStepper stepper, FILE* outfile)
{
#ifdef SUNDIALS_DEBUG_PRINTVEC
  int i;
#endif
  if (stepper == NULL) { return; }

  /* output data from the inner stepper */
  fprintf(outfile, "MRIStepInnerStepper Mem:\n");
  fprintf(outfile, "MRIStepInnerStepper: inner_nforcing = %i\n",
          stepper->nforcing);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  if (stepper->forcing != NULL)
  {
    for (i = 0; i < stepper->nforcing; i++)
    {
      fprintf(outfile, "MRIStep: inner_forcing[%i]:\n", i);
      N_VPrintFile(stepper->forcing[i], outfile);
    }
  }
#endif

  return;
}